

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::leave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int leaveIdx,bool polish)

{
  double dVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  undefined8 uVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  int *piVar8;
  pointer pnVar9;
  undefined8 uVar10;
  char cVar11;
  DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
  *pDVar12;
  int32_t iVar13;
  bool bVar14;
  int iVar15;
  cpp_dec_float<200U,_int,_void> *pcVar16;
  int extraout_var;
  undefined4 extraout_var_00;
  SPxOut *pSVar17;
  long lVar18;
  long lVar19;
  undefined7 in_register_00000011;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar20;
  pointer pnVar21;
  pointer pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  cpp_dec_float<200u,int,void> *pcVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  type *ptVar27;
  uint *puVar28;
  pointer pnVar29;
  undefined4 *puVar30;
  cpp_dec_float<200U,_int,_void> *pcVar31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar32;
  uint uVar33;
  long lVar34;
  byte bVar35;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar36;
  long lVar37;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar38;
  long in_FS_OFFSET;
  byte bVar39;
  ulong uVar40;
  Real RVar41;
  Status leaveStat;
  int leaveNum;
  uint local_d0c;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_d08;
  long local_d00;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_cf8;
  undefined8 uStack_cf0;
  DataKey local_ce0;
  SPxId leaveId;
  SPxId none;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterBound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  reject_treshold;
  cpp_dec_float<200U,_int,_void> local_b18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leaveMax;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [13];
  undefined3 uStack_92b;
  int iStack_928;
  undefined1 uStack_924;
  undefined8 local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newLBbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newUBbound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  newCoPrhs;
  uint local_690 [28];
  uint local_620 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  uint local_4b0 [28];
  int local_440;
  undefined1 local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar39 = 0;
  local_cf8 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(local_cf8._4_4_,(int)CONCAT71(in_register_00000011,polish));
  local_d00 = CONCAT71(local_d00._1_7_,this->instableLeave);
  pUVar2 = this->theCoPvec;
  if (((pUVar2->thedelta).setupStatus == true) && ((pUVar2->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::coSolve(&this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&pUVar2->thedelta,
              &(this->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[leaveIdx].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  }
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x86])(this);
  leaveId.super_DataKey.info = 0;
  leaveId.super_DataKey.idx = -1;
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  leaveMax.m_backend.fpclass = cpp_dec_float_finite;
  leaveMax.m_backend.prec_elem = 0x1c;
  leaveMax.m_backend.data._M_elems[0] = 0;
  leaveMax.m_backend.data._M_elems[1] = 0;
  leaveMax.m_backend.data._M_elems[2] = 0;
  leaveMax.m_backend.data._M_elems[3] = 0;
  leaveMax.m_backend.data._M_elems[4] = 0;
  leaveMax.m_backend.data._M_elems[5] = 0;
  leaveMax.m_backend.data._M_elems[6] = 0;
  leaveMax.m_backend.data._M_elems[7] = 0;
  leaveMax.m_backend.data._M_elems[8] = 0;
  leaveMax.m_backend.data._M_elems[9] = 0;
  leaveMax.m_backend.data._M_elems[10] = 0;
  leaveMax.m_backend.data._M_elems[0xb] = 0;
  leaveMax.m_backend.data._M_elems[0xc] = 0;
  leaveMax.m_backend.data._M_elems[0xd] = 0;
  leaveMax.m_backend.data._M_elems[0xe] = 0;
  leaveMax.m_backend.data._M_elems[0xf] = 0;
  leaveMax.m_backend.data._M_elems[0x10] = 0;
  leaveMax.m_backend.data._M_elems[0x11] = 0;
  leaveMax.m_backend.data._M_elems[0x12] = 0;
  leaveMax.m_backend.data._M_elems[0x13] = 0;
  leaveMax.m_backend.data._M_elems[0x14] = 0;
  leaveMax.m_backend.data._M_elems[0x15] = 0;
  leaveMax.m_backend.data._M_elems[0x16] = 0;
  leaveMax.m_backend.data._M_elems[0x17] = 0;
  leaveMax.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  leaveMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leaveMax.m_backend.exp = 0;
  leaveMax.m_backend.neg = false;
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems[0xe] = 0;
  leavebound.m_backend.data._M_elems[0xf] = 0;
  leavebound.m_backend.data._M_elems[0x10] = 0;
  leavebound.m_backend.data._M_elems[0x11] = 0;
  leavebound.m_backend.data._M_elems[0x12] = 0;
  leavebound.m_backend.data._M_elems[0x13] = 0;
  leavebound.m_backend.data._M_elems[0x14] = 0;
  leavebound.m_backend.data._M_elems[0x15] = 0;
  leavebound.m_backend.data._M_elems[0x16] = 0;
  leavebound.m_backend.data._M_elems[0x17] = 0;
  leavebound.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  local_920._0_4_ = cpp_dec_float_finite;
  local_920._4_4_ = 0x1c;
  local_998 = (undefined1  [16])0x0;
  local_988 = (undefined1  [16])0x0;
  local_978 = (undefined1  [16])0x0;
  local_968 = (undefined1  [16])0x0;
  local_958 = (undefined1  [16])0x0;
  local_948 = (undefined1  [16])0x0;
  local_938 = SUB1613((undefined1  [16])0x0,0);
  uStack_92b = 0;
  iStack_928 = 0;
  uStack_924 = 0;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x7f])(this,(ulong)(uint)leaveIdx,&leaveStat);
  if (((char)local_cf8 == '\0') && (this->m_maxCycle < this->m_numCycle)) {
    if (leaveMax.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00516212:
      lVar18 = 0x458;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&t.m_backend,0,(type *)0x0);
      iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leaveMax.m_backend,&t.m_backend);
      lVar18 = 0x460;
      if (iVar15 < 1) goto LAB_00516212;
    }
    (**(code **)((long)(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar18))(this);
    pcVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
    pcVar25 = pcVar16;
    pnVar23 = &this->m_nonbasicValue;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    }
    (this->m_nonbasicValue).m_backend.exp = pcVar16->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar16->neg;
    iVar13 = pcVar16->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar16->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar13;
    this->m_nonbasicValueUpToDate = false;
  }
  pnVar23 = &leaveMax;
  pcVar25 = &local_b18;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pcVar25->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
    pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_b18.exp = leaveMax.m_backend.exp;
  local_b18.neg = leaveMax.m_backend.neg;
  local_b18.fpclass = leaveMax.m_backend.fpclass;
  local_b18.prec_elem = leaveMax.m_backend.prec_elem;
  this->boundflips = 0;
  pnVar23 = &this->theShift;
  puVar28 = local_620;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    *puVar28 = (pnVar23->m_backend).data._M_elems[0];
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
  }
  iVar15 = (this->theShift).m_backend.exp;
  bVar14 = (this->theShift).m_backend.neg;
  uVar3._0_4_ = (this->theShift).m_backend.fpclass;
  uVar3._4_4_ = (this->theShift).m_backend.prec_elem;
  local_d0c = leaveIdx;
  local_ce0.info =
       (*this->theratiotester->_vptr_SPxRatioTester[8])
                 (this->theratiotester,&local_b18,(ulong)(uint)leaveIdx,(ulong)local_cf8 & 0xff);
  local_ce0.idx = extraout_var;
  pnVar23 = &this->theShift;
  pnVar26 = &local_b0;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (this->theShift).m_backend.exp;
  local_b0.m_backend.neg = (this->theShift).m_backend.neg;
  local_b0.m_backend.fpclass = (this->theShift).m_backend.fpclass;
  local_b0.m_backend.prec_elem = (this->theShift).m_backend.prec_elem;
  puVar28 = local_620;
  pnVar23 = &local_130;
  for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
    (pnVar23->m_backend).data._M_elems[0] = *puVar28;
    puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = iVar15;
  local_130.m_backend.neg = bVar14;
  local_130.m_backend._120_8_ = uVar3;
  RVar41 = Tolerances::epsilon((this->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  bVar14 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                     (&local_b0,&local_130,RVar41);
  if (bVar14) {
    pcVar16 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::zero();
    pcVar25 = pcVar16;
    pnVar23 = &this->m_nonbasicValue;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    }
    (this->m_nonbasicValue).m_backend.exp = pcVar16->exp;
    (this->m_nonbasicValue).m_backend.neg = pcVar16->neg;
    iVar13 = pcVar16->prec_elem;
    (this->m_nonbasicValue).m_backend.fpclass = pcVar16->fpclass;
    (this->m_nonbasicValue).m_backend.prec_elem = iVar13;
    this->m_nonbasicValueUpToDate = false;
  }
  this->instableLeaveNum = -1;
  this->instableLeave = false;
  if (local_ce0.info == 0) {
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x85])
              (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
    (**(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,0xffffffff,&none,0,0);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems[0] = 0;
    t.m_backend.data._M_elems[1] = 0;
    t.m_backend.data._M_elems[2] = 0;
    t.m_backend.data._M_elems[3] = 0;
    t.m_backend.data._M_elems[4] = 0;
    t.m_backend.data._M_elems[5] = 0;
    t.m_backend.data._M_elems[6] = 0;
    t.m_backend.data._M_elems[7] = 0;
    t.m_backend.data._M_elems[8] = 0;
    t.m_backend.data._M_elems[9] = 0;
    t.m_backend.data._M_elems[10] = 0;
    t.m_backend.data._M_elems[0xb] = 0;
    t.m_backend.data._M_elems[0xc] = 0;
    t.m_backend.data._M_elems[0xd] = 0;
    t.m_backend.data._M_elems[0xe] = 0;
    t.m_backend.data._M_elems[0xf] = 0;
    t.m_backend.data._M_elems[0x10] = 0;
    t.m_backend.data._M_elems[0x11] = 0;
    t.m_backend.data._M_elems[0x12] = 0;
    t.m_backend.data._M_elems[0x13] = 0;
    t.m_backend.data._M_elems[0x14] = 0;
    t.m_backend.data._M_elems[0x15] = 0;
    t.m_backend.data._M_elems[0x16] = 0;
    t.m_backend.data._M_elems[0x17] = 0;
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,0.0);
    pcVar24 = (cpp_dec_float<200u,int,void> *)&t;
    puVar30 = (undefined4 *)local_998;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      *puVar30 = *(undefined4 *)pcVar24;
      pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
      puVar30 = puVar30 + (ulong)bVar39 * -2 + 1;
    }
    iStack_928 = t.m_backend.exp;
    uStack_924 = t.m_backend.neg;
    local_920._0_4_ = t.m_backend.fpclass;
    local_920._4_4_ = t.m_backend.prec_elem;
    if ((char)local_cf8 != '\0') {
      return false;
    }
    pcVar25 = &local_b18;
    pnVar23 = &local_1b0;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_b18.exp;
    local_1b0.m_backend.neg = local_b18.neg;
    local_1b0.m_backend.fpclass = local_b18.fpclass;
    local_1b0.m_backend.prec_elem = local_b18.prec_elem;
    pnVar23 = &leaveMax;
    pnVar26 = &local_230;
    for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = leaveMax.m_backend.exp;
    local_230.m_backend.neg = leaveMax.m_backend.neg;
    local_230.m_backend.fpclass = leaveMax.m_backend.fpclass;
    local_230.m_backend.prec_elem = leaveMax.m_backend.prec_elem;
    RVar41 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar14 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_1b0,&local_230,RVar41);
    if (((~bVar14 | (byte)local_d00) & 1) == 0) {
      pnVar9 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar34 = (long)(int)local_d0c;
      this->instableLeaveNum = local_d0c;
      pnVar22 = pnVar9 + lVar34;
      pnVar23 = &this->instableLeaveVal;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
      }
      (this->instableLeaveVal).m_backend.exp = pnVar9[lVar34].m_backend.exp;
      (this->instableLeaveVal).m_backend.neg = pnVar9[lVar34].m_backend.neg;
      iVar13 = pnVar9[lVar34].m_backend.prec_elem;
      (this->instableLeaveVal).m_backend.fpclass = pnVar9[lVar34].m_backend.fpclass;
      (this->instableLeaveVal).m_backend.prec_elem = iVar13;
      reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
      reject_treshold.m_backend.prec_elem = 0x1c;
      reject_treshold.m_backend.data._M_elems[0] = 0;
      reject_treshold.m_backend.data._M_elems[1] = 0;
      reject_treshold.m_backend.data._M_elems[2] = 0;
      reject_treshold.m_backend.data._M_elems[3] = 0;
      reject_treshold.m_backend.data._M_elems[4] = 0;
      reject_treshold.m_backend.data._M_elems[5] = 0;
      reject_treshold.m_backend.data._M_elems[6] = 0;
      reject_treshold.m_backend.data._M_elems[7] = 0;
      reject_treshold.m_backend.data._M_elems[8] = 0;
      reject_treshold.m_backend.data._M_elems[9] = 0;
      reject_treshold.m_backend.data._M_elems[10] = 0;
      reject_treshold.m_backend.data._M_elems[0xb] = 0;
      reject_treshold.m_backend.data._M_elems[0xc] = 0;
      reject_treshold.m_backend.data._M_elems[0xd] = 0;
      reject_treshold.m_backend.data._M_elems[0xe] = 0;
      reject_treshold.m_backend.data._M_elems[0xf] = 0;
      reject_treshold.m_backend.data._M_elems[0x10] = 0;
      reject_treshold.m_backend.data._M_elems[0x11] = 0;
      reject_treshold.m_backend.data._M_elems[0x12] = 0;
      reject_treshold.m_backend.data._M_elems[0x13] = 0;
      reject_treshold.m_backend.data._M_elems[0x14] = 0;
      reject_treshold.m_backend.data._M_elems[0x15] = 0;
      reject_treshold.m_backend.data._M_elems[0x16] = 0;
      reject_treshold.m_backend.data._M_elems[0x17] = 0;
      reject_treshold.m_backend.data._M_elems[0x18] = 0;
      reject_treshold.m_backend.data._M_elems[0x19] = 0;
      reject_treshold.m_backend.data._M_elems._104_5_ = 0;
      reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      reject_treshold.m_backend.exp = 0;
      reject_treshold.m_backend.neg = false;
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&reject_treshold.m_backend,&(this->instableLeaveVal).m_backend,&t.m_backend);
      pnVar9 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar25 = &reject_treshold.m_backend;
      pnVar22 = pnVar9 + lVar34;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
        pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      pnVar9[lVar34].m_backend.exp = reject_treshold.m_backend.exp;
      pnVar9[lVar34].m_backend.neg = reject_treshold.m_backend.neg;
      pnVar9[lVar34].m_backend.fpclass = reject_treshold.m_backend.fpclass;
      pnVar9[lVar34].m_backend.prec_elem = reject_treshold.m_backend.prec_elem;
      return true;
    }
    if (1 < (this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).updateCount) {
      pSVar17 = this->spxout;
      if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
        t.m_backend.data._M_elems[0] = pSVar17->m_verbosity;
        reject_treshold.m_backend.data._M_elems[0] = 5;
        (*pSVar17->_vptr_SPxOut[2])();
        pSVar17 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar17->m_streams[pSVar17->m_verbosity],"ILEAVE01 factorization triggered in ",
                   0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar17->m_streams[pSVar17->m_verbosity],"leave() for feasibility test",0x1c);
        cVar11 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18) + cVar11)
        ;
        std::ostream::put(cVar11);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x75])(this);
      return true;
    }
    if (this->recomputedVectors == false) {
      pcVar25 = &local_b18;
      ptVar27 = &t;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (ptVar27->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      t.m_backend.exp = local_b18.exp;
      t.m_backend.neg = local_b18.neg;
      t.m_backend.fpclass = local_b18.fpclass;
      t.m_backend.prec_elem = local_b18.prec_elem;
      if ((local_b18.neg == true) &&
         (local_b18.fpclass != cpp_dec_float_finite || t.m_backend.data._M_elems[0] != 0)) {
        t.m_backend.neg = false;
      }
      leavetol(&reject_treshold,this);
      if (((t.m_backend.fpclass != cpp_dec_float_NaN) &&
          (reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&t.m_backend,&reject_treshold.m_backend), iVar15 < 0)) {
        pSVar17 = this->spxout;
        if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
          t.m_backend.data._M_elems[0] = pSVar17->m_verbosity;
          reject_treshold.m_backend.data._M_elems[0] = 5;
          (*pSVar17->_vptr_SPxOut[2])();
          pSVar17 = soplex::operator<<(this->spxout,
                                       "ILEAVE11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
        }
        computeFrhs(this);
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::solve(&this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->theFvec->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,this->theFrhs);
        computeFtest(this);
        this->recomputedVectors = true;
        return true;
      }
    }
    pSVar17 = this->spxout;
    if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
      t.m_backend.data._M_elems[0] = pSVar17->m_verbosity;
      reject_treshold.m_backend.data._M_elems[0] = 5;
      (*pSVar17->_vptr_SPxOut[2])();
      pSVar17 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity],
                 "ILEAVE02 unboundedness/infeasibility found ",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar17->m_streams[pSVar17->m_verbosity],"in leave()",10);
      cVar11 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18) + cVar11);
      std::ostream::put(cVar11);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
    }
    if (this->theRep == COLUMN) {
      pcVar25 = &local_b18;
      pnVar23 = &local_330;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = local_b18.exp;
      local_330.m_backend.neg = local_b18.neg;
      local_330.m_backend.fpclass = local_b18.fpclass;
      local_330.m_backend.prec_elem = local_b18.prec_elem;
      computeDualfarkas4Col(this,&local_330);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != INFEASIBLE) {
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = INFEASIBLE;
      }
    }
    else {
      pcVar25 = &local_b18;
      pnVar23 = &local_2b0;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = local_b18.exp;
      local_2b0.m_backend.neg = local_b18.neg;
      local_2b0.m_backend.fpclass = local_b18.fpclass;
      local_2b0.m_backend.prec_elem = local_b18.prec_elem;
      computePrimalray4Row(this,&local_2b0);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus != UNBOUNDED) {
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = UNBOUNDED;
      }
    }
    return false;
  }
  lVar18 = (long)(int)local_d0c;
  if (&local_ce0 ==
      &(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).theBaseId.data[lVar18].super_DataKey) {
    (**(this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._vptr_SPxBasisBase)
              (&this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,(ulong)local_d0c,&none,0,0);
    pDVar12 = &(this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thedesc.colstat;
    if (leaveId.super_DataKey.info < 0) {
      pDVar12 = &(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.rowstat;
    }
    lVar34 = (long)leaveNum;
    if (leaveStat == P_ON_UPPER) {
      pDVar12->data[lVar34] = P_ON_LOWER;
      pVVar20 = &this->theLCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar20 = &this->theLRbound;
      }
      pnVar9 = (pVVar20->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar22 = (this->theCoPrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar9 + lVar34;
      pnVar29 = pnVar22 + lVar18;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      pnVar22[lVar18].m_backend.exp = pnVar9[lVar34].m_backend.exp;
      pnVar22[lVar18].m_backend.neg = pnVar9[lVar34].m_backend.neg;
      iVar13 = pnVar9[lVar34].m_backend.prec_elem;
      pnVar22[lVar18].m_backend.fpclass = pnVar9[lVar34].m_backend.fpclass;
      pnVar22[lVar18].m_backend.prec_elem = iVar13;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theUBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend,0);
      ::soplex::infinity::__tls_init();
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,
                 (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_00601010));
      pnVar9 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar24 = (cpp_dec_float<200u,int,void> *)&t;
      pnVar22 = pnVar9 + lVar18;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
        pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      pnVar9[lVar18].m_backend.exp = t.m_backend.exp;
      pnVar9[lVar18].m_backend.neg = t.m_backend.neg;
      pnVar9[lVar18].m_backend.fpclass = t.m_backend.fpclass;
      pnVar9[lVar18].m_backend.prec_elem = t.m_backend.prec_elem;
    }
    else {
      pDVar12->data[lVar34] = P_ON_UPPER;
      pVVar20 = &this->theUCbound;
      if (leaveId.super_DataKey.info < 0) {
        pVVar20 = &this->theURbound;
      }
      pnVar9 = (pVVar20->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar22 = (this->theCoPrhs->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar21 = pnVar9 + lVar34;
      pnVar29 = pnVar22 + lVar18;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (pointer)((long)pnVar21 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar29 = (pointer)((long)pnVar29 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      pnVar22[lVar18].m_backend.exp = pnVar9[lVar34].m_backend.exp;
      pnVar22[lVar18].m_backend.neg = pnVar9[lVar34].m_backend.neg;
      iVar13 = pnVar9[lVar34].m_backend.prec_elem;
      pnVar22[lVar18].m_backend.fpclass = pnVar9[lVar34].m_backend.fpclass;
      pnVar22[lVar18].m_backend.prec_elem = iVar13;
      ::soplex::infinity::__tls_init();
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,*(double *)(in_FS_OFFSET + -8));
      pnVar9 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar24 = (cpp_dec_float<200u,int,void> *)&t;
      pnVar22 = pnVar9 + lVar18;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = *(undefined4 *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
        pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      pnVar9[lVar18].m_backend.exp = t.m_backend.exp;
      pnVar9[lVar18].m_backend.neg = t.m_backend.neg;
      pnVar9[lVar18].m_backend.fpclass = t.m_backend.fpclass;
      pnVar9[lVar18].m_backend.prec_elem = t.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theLBbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend,0);
    }
    pUVar2 = this->theCoPvec;
    pcVar25 = &local_b18;
    pnVar23 = &pUVar2->theval;
    for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    }
    (pUVar2->theval).m_backend.exp = local_b18.exp;
    (pUVar2->theval).m_backend.neg = local_b18.neg;
    (pUVar2->theval).m_backend.fpclass = local_b18.fpclass;
    (pUVar2->theval).m_backend.prec_elem = local_b18.prec_elem;
    pUVar2 = this->thePvec;
    pcVar25 = &local_b18;
    pnVar23 = &pUVar2->theval;
    for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
      (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
    }
    (pUVar2->theval).m_backend.exp = local_b18.exp;
    (pUVar2->theval).m_backend.neg = local_b18.neg;
    (pUVar2->theval).m_backend.fpclass = local_b18.fpclass;
    (pUVar2->theval).m_backend.prec_elem = local_b18.prec_elem;
    RVar41 = Tolerances::epsilon((this->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,RVar41);
    if (((local_b18.fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_b18,&t.m_backend), iVar15 < 1)) {
      RVar41 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      enterBound.m_backend.fpclass = cpp_dec_float_finite;
      enterBound.m_backend.prec_elem = 0x1c;
      enterBound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      enterBound.m_backend.data._M_elems[0x18] = 0;
      enterBound.m_backend.data._M_elems[0x19] = 0;
      enterBound.m_backend.data._M_elems._104_5_ = 0;
      enterBound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      enterBound.m_backend.exp = 0;
      enterBound.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&enterBound,RVar41);
      pcVar24 = (cpp_dec_float<200u,int,void> *)&enterBound;
      pnVar23 = &reject_treshold;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = *(uint *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      reject_treshold.m_backend.exp = enterBound.m_backend.exp;
      reject_treshold.m_backend.neg = enterBound.m_backend.neg;
      reject_treshold.m_backend.fpclass = enterBound.m_backend.fpclass;
      reject_treshold.m_backend.prec_elem = enterBound.m_backend.prec_elem;
      if (reject_treshold.m_backend.data._M_elems[0] != 0 ||
          enterBound.m_backend.fpclass != cpp_dec_float_finite) {
        reject_treshold.m_backend.neg = (bool)(enterBound.m_backend.neg ^ 1);
      }
      if (((enterBound.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_b18.fpclass != cpp_dec_float_NaN)) &&
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_b18,&reject_treshold.m_backend), iVar15 < 0))
      goto LAB_00516b5b;
    }
    else {
LAB_00516b5b:
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x87])(this);
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->theFvec->theval).m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&(this->m_pricingViol).m_backend,
               &(this->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
    t.m_backend.data._M_elems[0] = 0xffffffff;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar18),(int *)&t);
  }
  else {
    local_d08 = &this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    iVar15 = (*(this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._vptr_ClassArray[0x7e])(this,&local_ce0);
    local_cf8 = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(extraout_var_00,iVar15);
    pSVar4 = this->solveVector2;
    if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
LAB_00516d28:
      pSVar4 = this->solveVector3;
      pSVar36 = &this->theFvec->thedelta;
      if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::solve4update(local_d08,pSVar36,local_cf8);
      }
      else {
        pSVar5 = this->solveVector3rhs;
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized == false) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::factorize(local_d08);
        }
        pSVar7 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).factor;
        (*pSVar7->_vptr_SLinSolver[0x11])(pSVar7,pSVar36,pSVar4,local_cf8,pSVar5);
        pSVar4 = this->solveVector3;
        if (pSVar4->setupStatus == true) {
          lVar34 = (long)(pSVar4->super_IdxSet).num;
          if (0 < lVar34) {
            lVar34 = lVar34 + 1;
            do {
              piVar8 = (pSVar4->super_IdxSet).idx;
              pnVar9 = (pSVar4->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar15 = piVar8[lVar34 + -2];
              pnVar22 = pnVar9 + iVar15;
              pcVar25 = &t.m_backend;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pcVar25->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = pnVar9[iVar15].m_backend.exp;
              t.m_backend.neg = pnVar9[iVar15].m_backend.neg;
              t.m_backend.fpclass = pnVar9[iVar15].m_backend.fpclass;
              t.m_backend.prec_elem = pnVar9[iVar15].m_backend.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&(this->primVec).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar34 + -2]].m_backend,
                         &t.m_backend);
              lVar34 = lVar34 + -1;
            } while (1 < lVar34);
          }
        }
        else {
          uVar33 = (uint)((ulong)((long)(this->primVec).
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->primVec).
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 7);
          if (0 < (int)uVar33) {
            uVar40 = (ulong)(uVar33 & 0x7fffffff);
            lVar34 = uVar40 + 1;
            lVar19 = uVar40 << 7;
            do {
              pnVar9 = (pSVar4->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar28 = (uint *)((long)pnVar9[-1].m_backend.data._M_elems + lVar19);
              pcVar25 = &t.m_backend;
              for (lVar37 = 0x1c; lVar37 != 0; lVar37 = lVar37 + -1) {
                (pcVar25->data)._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19);
              t.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19 + 4U);
              t.m_backend._120_8_ =
                   *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19 + 8U);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)(this->primVec).
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                m_backend.data._M_elems + lVar19),&t.m_backend);
              lVar34 = lVar34 + -1;
              lVar19 = lVar19 + -0x80;
            } while (1 < lVar34);
          }
        }
LAB_00516f46:
        this->totalboundflips = this->totalboundflips + this->boundflips;
      }
    }
    else {
      pSVar36 = this->solveVector3;
      if (pSVar36 !=
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x0) {
        pSVar5 = this->solveVector2rhs;
        pSVar6 = this->solveVector3rhs;
        pUVar2 = this->theFvec;
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).factorized == false) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::factorize(local_d08);
        }
        pSVar7 = (this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).factor;
        (*pSVar7->_vptr_SLinSolver[0x13])
                  (pSVar7,&pUVar2->thedelta,pSVar4,pSVar36,local_cf8,pSVar5,pSVar6);
        pSVar4 = this->solveVector3;
        if (pSVar4->setupStatus == true) {
          lVar34 = (long)(pSVar4->super_IdxSet).num;
          if (0 < lVar34) {
            lVar34 = lVar34 + 1;
            do {
              piVar8 = (pSVar4->super_IdxSet).idx;
              pnVar9 = (pSVar4->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar15 = piVar8[lVar34 + -2];
              pnVar22 = pnVar9 + iVar15;
              pcVar25 = &t.m_backend;
              for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
                (pcVar25->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = pnVar9[iVar15].m_backend.exp;
              t.m_backend.neg = pnVar9[iVar15].m_backend.neg;
              t.m_backend.fpclass = pnVar9[iVar15].m_backend.fpclass;
              t.m_backend.prec_elem = pnVar9[iVar15].m_backend.prec_elem;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&(this->primVec).
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar34 + -2]].m_backend,
                         &t.m_backend);
              lVar34 = lVar34 + -1;
            } while (1 < lVar34);
          }
        }
        else {
          uVar33 = (uint)((ulong)((long)(this->primVec).
                                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->primVec).
                                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 7);
          if (0 < (int)uVar33) {
            uVar40 = (ulong)(uVar33 & 0x7fffffff);
            lVar34 = uVar40 + 1;
            lVar19 = uVar40 << 7;
            do {
              pnVar9 = (pSVar4->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar28 = (uint *)((long)pnVar9[-1].m_backend.data._M_elems + lVar19);
              pcVar25 = &t.m_backend;
              for (lVar37 = 0x1c; lVar37 != 0; lVar37 = lVar37 + -1) {
                (pcVar25->data)._M_elems[0] = *puVar28;
                puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19);
              t.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19 + 4U);
              t.m_backend._120_8_ =
                   *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar19 + 8U);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)(this->primVec).
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                                m_backend.data._M_elems + lVar19),&t.m_backend);
              lVar34 = lVar34 + -1;
              lVar19 = lVar19 + -0x80;
            } while (1 < lVar34);
          }
        }
        goto LAB_00516f46;
      }
      if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) goto LAB_00516d28;
      pSVar36 = this->solveVector2rhs;
      pUVar2 = this->theFvec;
      if ((this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(local_d08);
      }
      pSVar7 = (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x11])(pSVar7,&pUVar2->thedelta,pSVar4,local_cf8,pSVar36);
    }
    dVar1 = ((this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->s_epsilon_multiplier;
    uVar40 = -(ulong)(dVar1 == 1.0);
    reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
    reject_treshold.m_backend.prec_elem = 0x1c;
    reject_treshold.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    reject_treshold.m_backend.data._M_elems[0x18] = 0;
    reject_treshold.m_backend.data._M_elems[0x19] = 0;
    reject_treshold.m_backend.data._M_elems._104_5_ = 0;
    reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    reject_treshold.m_backend.exp = 0;
    reject_treshold.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&reject_treshold,
               (double)(~uVar40 & (ulong)(dVar1 * 1e-10) | uVar40 & 0x3ddb7cdfd9d7bdbb));
    pnVar9 = (this->theFvec->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar34 = lVar18 * 0x80;
    pnVar22 = pnVar9 + lVar18;
    puVar28 = local_690;
    for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
      *puVar28 = (pnVar22->m_backend).data._M_elems[0];
      pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar39 * -2 + 1) * 4);
      puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
    }
    iVar15 = pnVar9[lVar18].m_backend.exp;
    bVar14 = pnVar9[lVar18].m_backend.neg;
    uVar10._0_4_ = pnVar9[lVar18].m_backend.fpclass;
    uVar10._4_4_ = pnVar9[lVar18].m_backend.prec_elem;
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    puVar28 = local_690;
    ptVar27 = &t;
    for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
      (ptVar27->m_backend).data._M_elems[0] = *puVar28;
      puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    t.m_backend.neg = bVar14;
    if ((bVar14 == true) &&
       (t.m_backend.data._M_elems[0] != 0 || (fpclass_type)uVar10 != cpp_dec_float_finite)) {
      t.m_backend.neg = false;
    }
    t.m_backend.exp = iVar15;
    t.m_backend._120_8_ = uVar10;
    bVar35 = 0;
    if (((fpclass_type)uVar10 != cpp_dec_float_NaN) &&
       (bVar35 = 0, reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&t.m_backend,&reject_treshold.m_backend);
      bVar35 = (byte)((uint)iVar15 >> 0x1f);
    }
    if (bVar35 == 0) {
      RVar41 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t.m_backend,RVar41);
      local_d00 = lVar34;
      if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
          (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&leavebound.m_backend,&t.m_backend), iVar15 < 1)) {
        RVar41 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        newUBbound.m_backend.fpclass = cpp_dec_float_finite;
        newUBbound.m_backend.prec_elem = 0x1c;
        newUBbound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        newUBbound.m_backend.data._M_elems[0x18] = 0;
        newUBbound.m_backend.data._M_elems[0x19] = 0;
        newUBbound.m_backend.data._M_elems._104_5_ = 0;
        newUBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        newUBbound.m_backend.exp = 0;
        newUBbound.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&newUBbound,RVar41);
        pcVar24 = (cpp_dec_float<200u,int,void> *)&newUBbound;
        pnVar23 = &enterBound;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = *(uint *)pcVar24;
          pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        enterBound.m_backend.exp = newUBbound.m_backend.exp;
        enterBound.m_backend.neg = newUBbound.m_backend.neg;
        enterBound.m_backend.fpclass = newUBbound.m_backend.fpclass;
        enterBound.m_backend.prec_elem = newUBbound.m_backend.prec_elem;
        if (enterBound.m_backend.data._M_elems[0] != 0 ||
            newUBbound.m_backend.fpclass != cpp_dec_float_finite) {
          enterBound.m_backend.neg = (bool)(newUBbound.m_backend.neg ^ 1);
        }
        if (((newUBbound.m_backend.fpclass != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&leavebound.m_backend,&enterBound.m_backend), iVar15 < 0))
        goto LAB_005173ce;
      }
      else {
LAB_005173ce:
        pVVar20 = this->theFrhs;
        pnVar23 = &leavebound;
        pcVar25 = &enterBound.m_backend;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar25->data)->data)._M_elems[0] =
               (pnVar23->m_backend).data._M_elems[0];
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
        }
        enterBound.m_backend.exp = leavebound.m_backend.exp;
        enterBound.m_backend.neg = leavebound.m_backend.neg;
        enterBound.m_backend.fpclass = leavebound.m_backend.fpclass;
        enterBound.m_backend.prec_elem = leavebound.m_backend.prec_elem;
        if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
            enterBound.m_backend.data._M_elems[0] != 0) {
          enterBound.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
        }
        pSVar38 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).matrix.data[lVar18];
        lVar19 = (long)pSVar38->memused;
        lVar34 = local_d00;
        if (0 < lVar19) {
          lVar37 = lVar19 + 1;
          lVar19 = lVar19 * 0x84;
          do {
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pSVar38->m_elem[-1].val.m_backend.data._M_elems + lVar19);
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 0x1c;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems[6] = 0;
            t.m_backend.data._M_elems[7] = 0;
            t.m_backend.data._M_elems[8] = 0;
            t.m_backend.data._M_elems[9] = 0;
            t.m_backend.data._M_elems[10] = 0;
            t.m_backend.data._M_elems[0xb] = 0;
            t.m_backend.data._M_elems[0xc] = 0;
            t.m_backend.data._M_elems[0xd] = 0;
            t.m_backend.data._M_elems[0xe] = 0;
            t.m_backend.data._M_elems[0xf] = 0;
            t.m_backend.data._M_elems[0x10] = 0;
            t.m_backend.data._M_elems[0x11] = 0;
            t.m_backend.data._M_elems[0x12] = 0;
            t.m_backend.data._M_elems[0x13] = 0;
            t.m_backend.data._M_elems[0x14] = 0;
            t.m_backend.data._M_elems[0x15] = 0;
            t.m_backend.data._M_elems[0x16] = 0;
            t.m_backend.data._M_elems[0x17] = 0;
            t.m_backend.data._M_elems[0x18] = 0;
            t.m_backend.data._M_elems[0x19] = 0;
            t.m_backend.data._M_elems._104_5_ = 0;
            t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            pcVar25 = &enterBound.m_backend;
            if (pcVar16 != &t.m_backend) {
              pcVar31 = &t.m_backend;
              for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
                (pcVar31->data)._M_elems[0] =
                     (((cpp_dec_float<200U,_int,_void> *)&pcVar25->data)->data)._M_elems[0];
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = enterBound.m_backend.exp;
              t.m_backend.neg = enterBound.m_backend.neg;
              t.m_backend.fpclass = enterBound.m_backend.fpclass;
              t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
              pcVar25 = pcVar16;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&t.m_backend,pcVar25);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&(pVVar20->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)(&pSVar38->m_elem[-1].val + 1) + lVar19)].m_backend,
                       &t.m_backend);
            lVar37 = lVar37 + -1;
            lVar34 = local_d00;
            lVar19 = lVar19 + -0x84;
          } while (1 < lVar37);
        }
      }
      enterBound.m_backend.fpclass = cpp_dec_float_finite;
      enterBound.m_backend.prec_elem = 0x1c;
      enterBound.m_backend.data._M_elems[0] = 0;
      enterBound.m_backend.data._M_elems[1] = 0;
      enterBound.m_backend.data._M_elems[2] = 0;
      enterBound.m_backend.data._M_elems[3] = 0;
      enterBound.m_backend.data._M_elems[4] = 0;
      enterBound.m_backend.data._M_elems[5] = 0;
      enterBound.m_backend.data._M_elems[6] = 0;
      enterBound.m_backend.data._M_elems[7] = 0;
      enterBound.m_backend.data._M_elems[8] = 0;
      enterBound.m_backend.data._M_elems[9] = 0;
      enterBound.m_backend.data._M_elems[10] = 0;
      enterBound.m_backend.data._M_elems[0xb] = 0;
      enterBound.m_backend.data._M_elems[0xc] = 0;
      enterBound.m_backend.data._M_elems[0xd] = 0;
      enterBound.m_backend.data._M_elems[0xe] = 0;
      enterBound.m_backend.data._M_elems[0xf] = 0;
      enterBound.m_backend.data._M_elems[0x10] = 0;
      enterBound.m_backend.data._M_elems[0x11] = 0;
      enterBound.m_backend.data._M_elems[0x12] = 0;
      enterBound.m_backend.data._M_elems[0x13] = 0;
      enterBound.m_backend.data._M_elems[0x14] = 0;
      enterBound.m_backend.data._M_elems[0x15] = 0;
      enterBound.m_backend.data._M_elems[0x16] = 0;
      enterBound.m_backend.data._M_elems[0x17] = 0;
      enterBound.m_backend.data._M_elems[0x18] = 0;
      enterBound.m_backend.data._M_elems[0x19] = 0;
      enterBound.m_backend.data._M_elems._104_5_ = 0;
      enterBound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      enterBound.m_backend.exp = 0;
      enterBound.m_backend.neg = false;
      newUBbound.m_backend.fpclass = cpp_dec_float_finite;
      newUBbound.m_backend.prec_elem = 0x1c;
      newUBbound.m_backend.data._M_elems[0] = 0;
      newUBbound.m_backend.data._M_elems[1] = 0;
      newUBbound.m_backend.data._M_elems[2] = 0;
      newUBbound.m_backend.data._M_elems[3] = 0;
      newUBbound.m_backend.data._M_elems[4] = 0;
      newUBbound.m_backend.data._M_elems[5] = 0;
      newUBbound.m_backend.data._M_elems[6] = 0;
      newUBbound.m_backend.data._M_elems[7] = 0;
      newUBbound.m_backend.data._M_elems[8] = 0;
      newUBbound.m_backend.data._M_elems[9] = 0;
      newUBbound.m_backend.data._M_elems[10] = 0;
      newUBbound.m_backend.data._M_elems[0xb] = 0;
      newUBbound.m_backend.data._M_elems[0xc] = 0;
      newUBbound.m_backend.data._M_elems[0xd] = 0;
      newUBbound.m_backend.data._M_elems[0xe] = 0;
      newUBbound.m_backend.data._M_elems[0xf] = 0;
      newUBbound.m_backend.data._M_elems[0x10] = 0;
      newUBbound.m_backend.data._M_elems[0x11] = 0;
      newUBbound.m_backend.data._M_elems[0x12] = 0;
      newUBbound.m_backend.data._M_elems[0x13] = 0;
      newUBbound.m_backend.data._M_elems[0x14] = 0;
      newUBbound.m_backend.data._M_elems[0x15] = 0;
      newUBbound.m_backend.data._M_elems[0x16] = 0;
      newUBbound.m_backend.data._M_elems[0x17] = 0;
      newUBbound.m_backend.data._M_elems[0x18] = 0;
      newUBbound.m_backend.data._M_elems[0x19] = 0;
      newUBbound.m_backend.data._M_elems._104_5_ = 0;
      newUBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      newUBbound.m_backend.exp = 0;
      newUBbound.m_backend.neg = false;
      newLBbound.m_backend.fpclass = cpp_dec_float_finite;
      newLBbound.m_backend.prec_elem = 0x1c;
      newLBbound.m_backend.data._M_elems[0] = 0;
      newLBbound.m_backend.data._M_elems[1] = 0;
      newLBbound.m_backend.data._M_elems[2] = 0;
      newLBbound.m_backend.data._M_elems[3] = 0;
      newLBbound.m_backend.data._M_elems[4] = 0;
      newLBbound.m_backend.data._M_elems[5] = 0;
      newLBbound.m_backend.data._M_elems[6] = 0;
      newLBbound.m_backend.data._M_elems[7] = 0;
      newLBbound.m_backend.data._M_elems[8] = 0;
      newLBbound.m_backend.data._M_elems[9] = 0;
      newLBbound.m_backend.data._M_elems[10] = 0;
      newLBbound.m_backend.data._M_elems[0xb] = 0;
      newLBbound.m_backend.data._M_elems[0xc] = 0;
      newLBbound.m_backend.data._M_elems[0xd] = 0;
      newLBbound.m_backend.data._M_elems[0xe] = 0;
      newLBbound.m_backend.data._M_elems[0xf] = 0;
      newLBbound.m_backend.data._M_elems[0x10] = 0;
      newLBbound.m_backend.data._M_elems[0x11] = 0;
      newLBbound.m_backend.data._M_elems[0x12] = 0;
      newLBbound.m_backend.data._M_elems[0x13] = 0;
      newLBbound.m_backend.data._M_elems[0x14] = 0;
      newLBbound.m_backend.data._M_elems[0x15] = 0;
      newLBbound.m_backend.data._M_elems[0x16] = 0;
      newLBbound.m_backend.data._M_elems[0x17] = 0;
      newLBbound.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      newLBbound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      newLBbound.m_backend.exp = 0;
      newLBbound.m_backend.neg = false;
      newCoPrhs.m_backend.fpclass = cpp_dec_float_finite;
      newCoPrhs.m_backend.prec_elem = 0x1c;
      newCoPrhs.m_backend.data._M_elems[0] = 0;
      newCoPrhs.m_backend.data._M_elems[1] = 0;
      newCoPrhs.m_backend.data._M_elems[2] = 0;
      newCoPrhs.m_backend.data._M_elems[3] = 0;
      newCoPrhs.m_backend.data._M_elems[4] = 0;
      newCoPrhs.m_backend.data._M_elems[5] = 0;
      newCoPrhs.m_backend.data._M_elems[6] = 0;
      newCoPrhs.m_backend.data._M_elems[7] = 0;
      newCoPrhs.m_backend.data._M_elems[8] = 0;
      newCoPrhs.m_backend.data._M_elems[9] = 0;
      newCoPrhs.m_backend.data._M_elems[10] = 0;
      newCoPrhs.m_backend.data._M_elems[0xb] = 0;
      newCoPrhs.m_backend.data._M_elems[0xc] = 0;
      newCoPrhs.m_backend.data._M_elems[0xd] = 0;
      newCoPrhs.m_backend.data._M_elems[0xe] = 0;
      newCoPrhs.m_backend.data._M_elems[0xf] = 0;
      newCoPrhs.m_backend.data._M_elems[0x10] = 0;
      newCoPrhs.m_backend.data._M_elems[0x11] = 0;
      newCoPrhs.m_backend.data._M_elems[0x12] = 0;
      newCoPrhs.m_backend.data._M_elems[0x13] = 0;
      newCoPrhs.m_backend.data._M_elems[0x14] = 0;
      newCoPrhs.m_backend.data._M_elems[0x15] = 0;
      newCoPrhs.m_backend.data._M_elems[0x16] = 0;
      newCoPrhs.m_backend.data._M_elems[0x17] = 0;
      newCoPrhs.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      newCoPrhs.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      newCoPrhs.m_backend.exp = 0;
      newCoPrhs.m_backend.neg = false;
      pnVar23 = &leaveMax;
      puVar28 = local_4b0;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar28 = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      }
      local_440 = leaveMax.m_backend.exp;
      local_43c = leaveMax.m_backend.neg;
      local_438 = leaveMax.m_backend.fpclass;
      iStack_434 = leaveMax.m_backend.prec_elem;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x80])
                (this,local_4b0,local_ce0,&enterBound.m_backend,&newUBbound,&newLBbound,&newCoPrhs,
                 local_998);
      pnVar9 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar23 = &newUBbound;
      puVar28 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar34);
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar28 = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      }
      *(int *)((long)(&(pnVar9->m_backend).data + 1) + lVar34) = newUBbound.m_backend.exp;
      *(bool *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 4U) = newUBbound.m_backend.neg;
      *(undefined8 *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 8U) =
           newUBbound.m_backend._120_8_;
      pnVar9 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar23 = &newLBbound;
      puVar28 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar34);
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar28 = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      }
      *(int *)((long)(&(pnVar9->m_backend).data + 1) + lVar34) = newLBbound.m_backend.exp;
      *(bool *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 4U) = newLBbound.m_backend.neg;
      *(undefined8 *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 8U) =
           newLBbound.m_backend._120_8_;
      pnVar9 = (this->theCoPrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar23 = &newCoPrhs;
      puVar28 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar34);
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar28 = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      }
      *(int *)((long)(&(pnVar9->m_backend).data + 1) + lVar34) = newCoPrhs.m_backend.exp;
      *(bool *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 4U) = newCoPrhs.m_backend.neg;
      *(undefined8 *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 8U) =
           newCoPrhs.m_backend._120_8_;
      RVar41 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t.m_backend,RVar41);
      if (((enterBound.m_backend.fpclass == cpp_dec_float_NaN) ||
          (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&enterBound.m_backend,&t.m_backend), iVar15 < 1)) {
        RVar41 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_7,RVar41);
        pcVar24 = (cpp_dec_float<200u,int,void> *)&result_7;
        pnVar23 = &result_4;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = *(uint *)pcVar24;
          pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        result_4.m_backend.exp = result_7.m_backend.exp;
        result_4.m_backend.neg = result_7.m_backend.neg;
        result_4.m_backend.fpclass = result_7.m_backend.fpclass;
        result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_7.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
        }
        if (((result_7.m_backend.fpclass != cpp_dec_float_NaN) &&
            (enterBound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&enterBound.m_backend,&result_4.m_backend), iVar15 < 0))
        goto LAB_0051787d;
      }
      else {
LAB_0051787d:
        lVar34 = (long)local_cf8->memused;
        if (0 < lVar34) {
          pVVar20 = this->theFrhs;
          lVar19 = lVar34 + 1;
          pSVar38 = local_cf8;
          lVar34 = lVar34 * 0x84;
          do {
            pcVar16 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pSVar38->m_elem[-1].val.m_backend.data._M_elems + lVar34);
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 0x1c;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems[6] = 0;
            t.m_backend.data._M_elems[7] = 0;
            t.m_backend.data._M_elems[8] = 0;
            t.m_backend.data._M_elems[9] = 0;
            t.m_backend.data._M_elems[10] = 0;
            t.m_backend.data._M_elems[0xb] = 0;
            t.m_backend.data._M_elems[0xc] = 0;
            t.m_backend.data._M_elems[0xd] = 0;
            t.m_backend.data._M_elems[0xe] = 0;
            t.m_backend.data._M_elems[0xf] = 0;
            t.m_backend.data._M_elems[0x10] = 0;
            t.m_backend.data._M_elems[0x11] = 0;
            t.m_backend.data._M_elems[0x12] = 0;
            t.m_backend.data._M_elems[0x13] = 0;
            t.m_backend.data._M_elems[0x14] = 0;
            t.m_backend.data._M_elems[0x15] = 0;
            t.m_backend.data._M_elems[0x16] = 0;
            t.m_backend.data._M_elems[0x17] = 0;
            t.m_backend.data._M_elems[0x18] = 0;
            t.m_backend.data._M_elems[0x19] = 0;
            t.m_backend.data._M_elems._104_5_ = 0;
            t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            pcVar25 = &enterBound.m_backend;
            if (pcVar16 != &t.m_backend) {
              pcVar31 = &t.m_backend;
              for (lVar37 = 0x1c; lVar37 != 0; lVar37 = lVar37 + -1) {
                (pcVar31->data)._M_elems[0] =
                     (((cpp_dec_float<200U,_int,_void> *)&pcVar25->data)->data)._M_elems[0];
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4)
                ;
                pcVar31 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar31 + (ulong)bVar39 * -8 + 4)
                ;
              }
              t.m_backend.exp = enterBound.m_backend.exp;
              t.m_backend.neg = enterBound.m_backend.neg;
              t.m_backend.fpclass = enterBound.m_backend.fpclass;
              t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
              pcVar25 = pcVar16;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      (&t.m_backend,pcVar25);
            pSVar38 = local_cf8;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&(pVVar20->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)(&local_cf8->m_elem[-1].val + 1) + lVar34)].m_backend,
                       &t.m_backend);
            lVar19 = lVar19 + -1;
            lVar34 = lVar34 + -0x84;
          } while (1 < lVar19);
        }
      }
      pUVar2 = this->theCoPvec;
      pcVar25 = &local_b18;
      pnVar23 = &pUVar2->theval;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
      }
      (pUVar2->theval).m_backend.exp = local_b18.exp;
      (pUVar2->theval).m_backend.neg = local_b18.neg;
      (pUVar2->theval).m_backend.fpclass = local_b18.fpclass;
      (pUVar2->theval).m_backend.prec_elem = local_b18.prec_elem;
      pUVar2 = this->thePvec;
      pcVar25 = &local_b18;
      pnVar23 = &pUVar2->theval;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
      }
      (pUVar2->theval).m_backend.exp = local_b18.exp;
      (pUVar2->theval).m_backend.neg = local_b18.neg;
      (pUVar2->theval).m_backend.fpclass = local_b18.fpclass;
      (pUVar2->theval).m_backend.prec_elem = local_b18.prec_elem;
      RVar41 = Tolerances::epsilon((this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,RVar41);
      if (((local_b18.fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN))
         || (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_b18,&t.m_backend), lVar34 = local_d00, uVar33 = local_d0c,
            iVar15 < 1)) {
        lVar34 = local_d00;
        uVar33 = local_d0c;
        RVar41 = Tolerances::epsilon((this->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        result_7.m_backend.fpclass = cpp_dec_float_finite;
        result_7.m_backend.prec_elem = 0x1c;
        result_7.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result_7.m_backend.data._M_elems[0x18] = 0;
        result_7.m_backend.data._M_elems[0x19] = 0;
        result_7.m_backend.data._M_elems._104_5_ = 0;
        result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_7.m_backend.exp = 0;
        result_7.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_7,RVar41);
        pcVar24 = (cpp_dec_float<200u,int,void> *)&result_7;
        pnVar23 = &result_4;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = *(uint *)pcVar24;
          pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        result_4.m_backend.exp = result_7.m_backend.exp;
        result_4.m_backend.neg = result_7.m_backend.neg;
        result_4.m_backend.fpclass = result_7.m_backend.fpclass;
        result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
        if (result_4.m_backend.data._M_elems[0] != 0 ||
            result_7.m_backend.fpclass != cpp_dec_float_finite) {
          result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
        }
        if (((result_7.m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_b18.fpclass != cpp_dec_float_NaN)) &&
           (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&local_b18,&result_4.m_backend), iVar15 < 0)) goto LAB_00517c8d;
      }
      else {
LAB_00517c8d:
        (*(this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x87])(this);
      }
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)(((this->theFvec->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar34);
      result_7.m_backend.fpclass = cpp_dec_float_finite;
      result_7.m_backend.prec_elem = 0x1c;
      result_7.m_backend.data._M_elems[0] = 0;
      result_7.m_backend.data._M_elems[1] = 0;
      result_7.m_backend.data._M_elems[2] = 0;
      result_7.m_backend.data._M_elems[3] = 0;
      result_7.m_backend.data._M_elems[4] = 0;
      result_7.m_backend.data._M_elems[5] = 0;
      result_7.m_backend.data._M_elems[6] = 0;
      result_7.m_backend.data._M_elems[7] = 0;
      result_7.m_backend.data._M_elems[8] = 0;
      result_7.m_backend.data._M_elems[9] = 0;
      result_7.m_backend.data._M_elems[10] = 0;
      result_7.m_backend.data._M_elems[0xb] = 0;
      result_7.m_backend.data._M_elems[0xc] = 0;
      result_7.m_backend.data._M_elems[0xd] = 0;
      result_7.m_backend.data._M_elems[0xe] = 0;
      result_7.m_backend.data._M_elems[0xf] = 0;
      result_7.m_backend.data._M_elems[0x10] = 0;
      result_7.m_backend.data._M_elems[0x11] = 0;
      result_7.m_backend.data._M_elems[0x12] = 0;
      result_7.m_backend.data._M_elems[0x13] = 0;
      result_7.m_backend.data._M_elems[0x14] = 0;
      result_7.m_backend.data._M_elems[0x15] = 0;
      result_7.m_backend.data._M_elems[0x16] = 0;
      result_7.m_backend.data._M_elems[0x17] = 0;
      result_7.m_backend.data._M_elems[0x18] = 0;
      result_7.m_backend.data._M_elems[0x19] = 0;
      result_7.m_backend.data._M_elems._104_5_ = 0;
      result_7.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_7.m_backend.exp = 0;
      result_7.m_backend.neg = false;
      if (&result_7 != pnVar23) {
        pnVar26 = pnVar23;
        pnVar32 = &result_7;
        for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
          (pnVar32->m_backend).data._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
          pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar32 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        result_7.m_backend.exp = (pnVar23->m_backend).exp;
        result_7.m_backend.neg = (pnVar23->m_backend).neg;
        result_7.m_backend.fpclass = (pnVar23->m_backend).fpclass;
        result_7.m_backend.prec_elem = (pnVar23->m_backend).prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&result_7.m_backend,&leavebound.m_backend);
      pcVar25 = &result_7.m_backend;
      pnVar23 = &result_4;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      result_4.m_backend.exp = result_7.m_backend.exp;
      result_4.m_backend.neg = result_7.m_backend.neg;
      result_4.m_backend.fpclass = result_7.m_backend.fpclass;
      result_4.m_backend.prec_elem = result_7.m_backend.prec_elem;
      if (result_7.m_backend.fpclass != cpp_dec_float_finite ||
          result_4.m_backend.data._M_elems[0] != 0) {
        result_4.m_backend.neg = (bool)(result_7.m_backend.neg ^ 1);
      }
      pnVar9 = (this->theFvec->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar28 = (uint *)((long)(pnVar9->m_backend).data._M_elems + lVar34);
      pcVar25 = &local_530;
      for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
        (pcVar25->data)._M_elems[0] = *puVar28;
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
      }
      local_530.exp = *(int *)((long)(&(pnVar9->m_backend).data + 1) + lVar34);
      local_530.neg = *(bool *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 4U);
      local_530._120_8_ = *(undefined8 *)((long)(&(pnVar9->m_backend).data + 1) + lVar34 + 8U);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&t.m_backend,&result_4.m_backend,&local_530);
      pUVar2 = this->theFvec;
      pcVar25 = &t.m_backend;
      pnVar23 = &pUVar2->theval;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + (ulong)bVar39 * -8 + 4);
      }
      (pUVar2->theval).m_backend.exp = t.m_backend.exp;
      (pUVar2->theval).m_backend.neg = t.m_backend.neg;
      (pUVar2->theval).m_backend.fpclass = t.m_backend.fpclass;
      (pUVar2->theval).m_backend.prec_elem = t.m_backend.prec_elem;
      pUVar2 = this->theFvec;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::
      multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)pUVar2,&pUVar2->theval,&pUVar2->thedelta);
      pnVar23 = &this->theFvec->theval;
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      if (&t.m_backend == &pnVar23->m_backend) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&t.m_backend,&enterBound.m_backend);
        if (t.m_backend.data._M_elems[0] != 0 || t.m_backend.fpclass != cpp_dec_float_finite) {
          t.m_backend.neg = (bool)(t.m_backend.neg ^ 1);
        }
      }
      else {
        pnVar26 = &enterBound;
        pcVar25 = &t.m_backend;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (pcVar25->data)._M_elems[0] = (pnVar26->m_backend).data._M_elems[0];
          pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar39 * -8 + 4);
        }
        t.m_backend.exp = enterBound.m_backend.exp;
        t.m_backend.neg = enterBound.m_backend.neg;
        t.m_backend.fpclass = enterBound.m_backend.fpclass;
        t.m_backend.prec_elem = enterBound.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&t.m_backend,&pnVar23->m_backend);
      }
      bVar14 = false;
      pnVar9 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ptVar27 = &t;
      puVar28 = (uint *)((long)(pnVar9->m_backend).data._M_elems + local_d00);
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        *puVar28 = (ptVar27->m_backend).data._M_elems[0];
        ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar39 * -2 + 1) * 4);
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
      }
      *(int *)((long)(&(pnVar9->m_backend).data + 1) + local_d00) = t.m_backend.exp;
      *(bool *)((long)(&(pnVar9->m_backend).data + 1) + local_d00 + 4U) = t.m_backend.neg;
      *(undefined8 *)((long)(&(pnVar9->m_backend).data + 1) + local_d00 + 8U) = t.m_backend._120_8_;
      updateFtest(this);
      puVar28 = (uint *)local_998;
      pnVar23 = &local_5b0;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar23->m_backend).data._M_elems[0] = *puVar28;
        puVar28 = puVar28 + (ulong)bVar39 * -2 + 1;
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      local_5b0.m_backend.exp = iStack_928;
      local_5b0.m_backend.neg = (bool)uStack_924;
      local_5b0.m_backend.fpclass = (fpclass_type)local_920;
      local_5b0.m_backend.prec_elem = local_920._4_4_;
      updateNonbasicValue(this,&local_5b0);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (local_d08,(ulong)uVar33,&local_ce0,local_cf8,&this->theFvec->thedelta);
    }
    else if ((byte)local_d00 == '\0') {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear(&this->theFvec->thedelta);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x85])
                (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,local_cf8);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)(local_d08,0xffffffff,&none,0,0);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,0.0);
      pcVar24 = (cpp_dec_float<200u,int,void> *)&t;
      puVar30 = (undefined4 *)local_998;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        *puVar30 = *(undefined4 *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
        puVar30 = puVar30 + (ulong)bVar39 * -2 + 1;
      }
      iStack_928 = t.m_backend.exp;
      uStack_924 = t.m_backend.neg;
      local_920._0_4_ = t.m_backend.fpclass;
      local_920._4_4_ = t.m_backend.prec_elem;
      pnVar9 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t.m_backend,0.01);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&pnVar9[lVar18].m_backend,&t.m_backend);
      bVar14 = true;
    }
    else {
      pSVar17 = this->spxout;
      if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
        t.m_backend.data._M_elems[0] = pSVar17->m_verbosity;
        enterBound.m_backend.data._M_elems[0] = 5;
        (*pSVar17->_vptr_SPxOut[2])();
        pSVar17 = this->spxout;
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar17->m_streams[pSVar17->m_verbosity],
                   "ILEAVE03 unboundedness/infeasibility found ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pSVar17->m_streams[pSVar17->m_verbosity],"in leave()",10);
        cVar11 = (char)pSVar17->m_streams[pSVar17->m_verbosity];
        std::ios::widen((char)*(undefined8 *)
                               (*(long *)pSVar17->m_streams[pSVar17->m_verbosity] + -0x18) + cVar11)
        ;
        std::ostream::put(cVar11);
        std::ostream::flush();
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&t);
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x85])
                (this,(ulong)(uint)leaveNum,leaveId.super_DataKey,(ulong)(uint)leaveStat,0);
      (**(this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)(local_d08,0xffffffff,&none,0,0);
      t.m_backend.fpclass = cpp_dec_float_finite;
      t.m_backend.prec_elem = 0x1c;
      t.m_backend.data._M_elems[0] = 0;
      t.m_backend.data._M_elems[1] = 0;
      t.m_backend.data._M_elems[2] = 0;
      t.m_backend.data._M_elems[3] = 0;
      t.m_backend.data._M_elems[4] = 0;
      t.m_backend.data._M_elems[5] = 0;
      t.m_backend.data._M_elems[6] = 0;
      t.m_backend.data._M_elems[7] = 0;
      t.m_backend.data._M_elems[8] = 0;
      t.m_backend.data._M_elems[9] = 0;
      t.m_backend.data._M_elems[10] = 0;
      t.m_backend.data._M_elems[0xb] = 0;
      t.m_backend.data._M_elems[0xc] = 0;
      t.m_backend.data._M_elems[0xd] = 0;
      t.m_backend.data._M_elems[0xe] = 0;
      t.m_backend.data._M_elems[0xf] = 0;
      t.m_backend.data._M_elems[0x10] = 0;
      t.m_backend.data._M_elems[0x11] = 0;
      t.m_backend.data._M_elems[0x12] = 0;
      t.m_backend.data._M_elems[0x13] = 0;
      t.m_backend.data._M_elems[0x14] = 0;
      t.m_backend.data._M_elems[0x15] = 0;
      t.m_backend.data._M_elems[0x16] = 0;
      t.m_backend.data._M_elems[0x17] = 0;
      t.m_backend.data._M_elems[0x18] = 0;
      t.m_backend.data._M_elems[0x19] = 0;
      t.m_backend.data._M_elems._104_5_ = 0;
      t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      t.m_backend.exp = 0;
      t.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&t,0.0);
      pcVar24 = (cpp_dec_float<200u,int,void> *)&t;
      puVar30 = (undefined4 *)local_998;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        *puVar30 = *(undefined4 *)pcVar24;
        pcVar24 = pcVar24 + (ulong)bVar39 * -8 + 4;
        puVar30 = puVar30 + (ulong)bVar39 * -2 + 1;
      }
      iStack_928 = t.m_backend.exp;
      uStack_924 = t.m_backend.neg;
      local_920._0_4_ = t.m_backend.fpclass;
      local_920._4_4_ = t.m_backend.prec_elem;
      if (this->theRep == ROW) {
        pcVar25 = &local_b18;
        pnVar23 = &local_3b0;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4)
          ;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_3b0.m_backend.exp = local_b18.exp;
        local_3b0.m_backend.neg = local_b18.neg;
        local_3b0.m_backend.fpclass = local_b18.fpclass;
        local_3b0.m_backend.prec_elem = local_b18.prec_elem;
        computePrimalray4Row(this,&local_3b0);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus != UNBOUNDED) {
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus = UNBOUNDED;
        }
      }
      else {
        pcVar25 = &local_b18;
        pnVar23 = &local_430;
        for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = (pcVar25->data)._M_elems[0];
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar39 * -2 + 1) * 4)
          ;
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        }
        local_430.m_backend.exp = local_b18.exp;
        local_430.m_backend.neg = local_b18.neg;
        local_430.m_backend.fpclass = local_b18.fpclass;
        local_430.m_backend.prec_elem = local_b18.prec_elem;
        computeDualfarkas4Col(this,&local_430);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus != INFEASIBLE) {
          (this->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus = INFEASIBLE;
        }
      }
      bVar14 = false;
    }
    if (bVar35 != 0) {
      return bVar14;
    }
  }
  entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&t,this);
  if (((leaveMax.m_backend.fpclass == cpp_dec_float_NaN) ||
      (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leaveMax.m_backend,&t.m_backend), iVar15 < 1)) {
LAB_00518248:
    entertol(&newUBbound,this);
    pnVar23 = &newUBbound;
    pnVar26 = &enterBound;
    for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
      pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
    }
    enterBound.m_backend.exp = newUBbound.m_backend.exp;
    enterBound.m_backend.neg = newUBbound.m_backend.neg;
    enterBound.m_backend.fpclass = newUBbound.m_backend.fpclass;
    enterBound.m_backend.prec_elem = newUBbound.m_backend.prec_elem;
    if (enterBound.m_backend.data._M_elems[0] != 0 ||
        newUBbound.m_backend.fpclass != cpp_dec_float_finite) {
      enterBound.m_backend.neg = (bool)(newUBbound.m_backend.neg ^ 1);
    }
    if (((newUBbound.m_backend.fpclass != cpp_dec_float_NaN) &&
        (leaveMax.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&leaveMax.m_backend,&enterBound.m_backend), iVar15 < 0)) {
      entertol(&newCoPrhs,this);
      pnVar23 = &newCoPrhs;
      pnVar26 = &newLBbound;
      for (lVar34 = 0x1c; lVar34 != 0; lVar34 = lVar34 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
        pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar23 + ((ulong)bVar39 * -2 + 1) * 4);
        pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar26 + ((ulong)bVar39 * -2 + 1) * 4);
      }
      newLBbound.m_backend.exp = newCoPrhs.m_backend.exp;
      newLBbound.m_backend.neg = newCoPrhs.m_backend.neg;
      newLBbound.m_backend.fpclass = newCoPrhs.m_backend.fpclass;
      newLBbound.m_backend.prec_elem = newCoPrhs.m_backend.prec_elem;
      if (newLBbound.m_backend.data._M_elems[0] != 0 ||
          newCoPrhs.m_backend.fpclass != cpp_dec_float_finite) {
        newLBbound.m_backend.neg = (bool)(newCoPrhs.m_backend.neg ^ 1);
      }
      if (((newCoPrhs.m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_b18.fpclass != cpp_dec_float_NaN)) &&
         (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&local_b18,&newLBbound.m_backend), -1 < iVar15)) goto LAB_00518371;
    }
    this->m_numCycle = this->m_numCycle / 2;
  }
  else {
    entertol(&reject_treshold,this);
    if (((local_b18.fpclass == cpp_dec_float_NaN) ||
        (reject_treshold.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_b18,&reject_treshold.m_backend), 0 < iVar15)) goto LAB_00518248;
LAB_00518371:
    pcVar25 = &(this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
    ::soplex::infinity::__tls_init();
    local_cf8 = *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  **)(in_FS_OFFSET + -8);
    t.m_backend.fpclass = cpp_dec_float_finite;
    t.m_backend.prec_elem = 0x1c;
    t.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    t.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    t.m_backend.data._M_elems[0x18] = 0;
    t.m_backend.data._M_elems[0x19] = 0;
    t.m_backend.data._M_elems._104_5_ = 0;
    t.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    t.m_backend.exp = 0;
    t.m_backend.neg = false;
    uStack_cf0 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&t,(double)local_cf8);
    if (((pcVar25->fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar25,&t.m_backend), -1 < iVar15)) {
      pcVar25 = &(this->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
      ::soplex::infinity::__tls_init();
      reject_treshold.m_backend.fpclass = cpp_dec_float_finite;
      reject_treshold.m_backend.prec_elem = 0x1c;
      reject_treshold.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._16_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._32_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._48_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._64_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems._80_16_ = ZEXT816(0);
      reject_treshold.m_backend.data._M_elems[0x18] = 0;
      reject_treshold.m_backend.data._M_elems[0x19] = 0;
      reject_treshold.m_backend.data._M_elems._104_5_ = 0;
      reject_treshold.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      reject_treshold.m_backend.exp = 0;
      reject_treshold.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&reject_treshold,
                 (double)((ulong)local_cf8 ^ (ulong)DAT_00601010));
      bVar14 = false;
      if ((pcVar25->fpclass != cpp_dec_float_NaN) &&
         (bVar14 = false, reject_treshold.m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar15 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (pcVar25,&reject_treshold.m_backend);
        bVar14 = 0 < iVar15;
      }
      if (!bVar14) {
        return true;
      }
    }
    if (leaveStat != P_FREE) {
      if (leaveStat != D_FREE) {
        this->m_numCycle = this->m_numCycle + 1;
        this->leaveCycles = this->leaveCycles + 1;
        return true;
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::leave(int leaveIdx, bool polish)
{
   assert(leaveIdx < dim() && leaveIdx >= 0);
   assert(type() == LEAVE);
   assert(initialized);

   bool instable = instableLeave;
   assert(!instable || instableLeaveNum >= 0);

   /*
     Before performing the actual basis update, we must determine, how this
     is to be accomplished.
     When using steepest edge pricing this solve is already performed by the pricer
   */
   if(theCoPvec->delta().isSetup() && theCoPvec->delta().size() == 0)
   {
      this->coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);
   }

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      SSVectorBase<R>  tmp(dim(), this->tolerances());
      tmp.clear();
      this->coSolve(tmp, unitVecs[leaveIdx]);
      tmp -= theCoPvec->delta();

      if(tmp.length() > leavetol())
      {
         // This happens very frequently and does usually not hurt, so print
         // these warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE60 iteration=" << basis().iteration()
                       << ": coPvec.delta error = " << tmp.length()
                       << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   setupPupdate();

   assert(thePvec->isConsistent());
   assert(theCoPvec->isConsistent());

   typename SPxBasisBase<R>::Desc::Status leaveStat;      // status of leaving var
   SPxId leaveId;        // id of leaving var
   SPxId none;           // invalid id used if leave fails
   R leaveMax;       // maximium lambda of leaving var
   R leavebound;     // current fVec value of leaving var
   int  leaveNum;       // number of leaveId in bounds
   StableSum<R> objChange; // amount of change in the objective function

   getLeaveVals(leaveIdx, leaveStat, leaveId, leaveMax, leavebound, leaveNum, objChange);

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(leaveMax > 0)
         perturbMaxLeave();
      else
         perturbMinLeave();

      //@ m_numCycle /= 2;
      // perturbation invalidates the currently stored nonbasic value
      forceRecompNonbasicValue();
   }

   //@ testBounds();

   R enterVal = leaveMax;
   boundflips = 0;
   R oldShift = theShift;
   SPxId enterId = theratiotester->selectEnter(enterVal, leaveIdx, polish);

   if(NE(theShift, oldShift, this->tolerances()->epsilon()))
   {
      SPxOut::debug(this,
                    "DLEAVE71 trigger recomputation of nonbasic value due to shifts in ratiotest\n");
      forceRecompNonbasicValue();
   }

   assert(!enterId.isValid() || !isBasic(enterId));

   instableLeaveNum = -1;
   instableLeave = false;

   /*
     No variable could be selected to enter the basis and even the leaving
     variable is unbounded.
   */
   if(!enterId.isValid())
   {
      /* the following line originally was below in "rejecting leave" case;
         we need it in the unbounded/infeasible case, too, to have the
         correct basis size */
      rejectLeave(leaveNum, leaveId, leaveStat);
      this->change(-1, none, nullptr);
      objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

      if(polish)
         return false;

      if(NE(enterVal, leaveMax, this->tolerances()->epsilon()))
      {
         SPxOut::debug(this, "DLEAVE61 rejecting leave A (leaveIdx={}, theCoTest={})\n", leaveIdx,
                       theCoTest[leaveIdx]);

         /* In the LEAVE algorithm, when for a selected leaving variable we find only
            an instable entering variable, then the basis change is not conducted.
            Instead, we save the leaving variable's index in instableLeaveNum and scale
            theCoTest[leaveIdx] down by some factor, hoping to find a different leaving
            variable with a stable entering variable.
            If this fails, however, and no more leaving variable is found, we have to
            perform the instable basis change using instableLeaveNum. In this (and only
            in this) case, the flag instableLeave is set to true.

            enterVal != leaveMax is the case that selectEnter has found only an instable entering
            variable. We store this leaving variable for later -- if we are not already in the
            instable case: then we continue and conclude unboundedness/infeasibility */
         if(!instable)
         {
            instableLeaveNum = leaveIdx;

            // Note: These changes do not survive a refactorization
            instableLeaveVal = theCoTest[leaveIdx];
            theCoTest[leaveIdx] = instableLeaveVal / 10.0;

            return true;
         }
      }

      if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE01 factorization triggered in "
                       << "leave() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the leaving column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return true;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation */
      if(!recomputedVectors && spxAbs(enterVal) < leavetol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "ILEAVE11 clean up step to reduce numerical errors" <<
                       std::endl;)

         computeFrhs();
         SPxBasisBase<R>::solve(*theFvec, *theFrhs);
         computeFtest();

         /* only do this once per solve */
         recomputedVectors = true;

         return true;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE02 unboundedness/infeasibility found "
                    << "in leave()" << std::endl;)

      if(rep() != COLUMN)
      {
         computePrimalray4Row(enterVal);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }
      else
      {
         computeDualfarkas4Col(enterVal);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }

      return false;
   }
   else
   {
      /*
        If an entering variable has been found, a regular basis update is to
        be performed.
      */
      if(enterId != this->baseId((leaveIdx)))
      {
         const SVectorBase<R>& newVector = *enterVector(enterId);

         // update feasibility vectors
         if(solveVector2 != nullptr && solveVector3 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          *solveVector3,
                                          newVector,
                                          *solveVector2rhs,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else if(solveVector2 != nullptr)
         {
            assert(solveVector2->isConsistent());
            assert(solveVector2rhs->isSetup());

            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector2,
                                          newVector,
                                          *solveVector2rhs);
         }
         else if(solveVector3 != nullptr)
         {
            assert(solveVector3->isConsistent());
            assert(solveVector3rhs->isSetup());
            assert(boundflips > 0);
            SPxBasisBase<R>::solve4update(theFvec->delta(),
                                          *solveVector3,
                                          newVector,
                                          *solveVector3rhs);

            // perform update of basic solution
            primVec -= (*solveVector3);
            SPxOut::debug(this, "ILBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
            totalboundflips += boundflips;
         }
         else
            SPxBasisBase<R>::solve4update(theFvec->delta(), newVector);

#ifdef ENABLE_ADDITIONAL_CHECKS
         {
            SSVectorBase<R>  tmp(dim(), this->tolerances());
            SPxBasisBase<R>::solve(tmp, newVector);
            tmp -= fVec().delta();

            if(tmp.length() > entertol())
            {
               // This happens very frequently and does usually not hurt, so print
               // these warnings only with verbose level INFO2 and higher.
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE62\t(" << tmp.length() << ")\n";)
            }
         }
#endif  // ENABLE_ADDITIONAL_CHECKS

         R reject_treshold = this->tolerances()->scaleAccordingToEpsilon(default_reject_leave_tol);

         if(spxAbs(theFvec->delta()[leaveIdx]) < reject_treshold)
         {
            if(instable)
            {
               /* We are in the case that for all leaving variables only instable entering
                  variables were found: Thus, above we already accepted such an instable
                  entering variable. Now even this seems to be impossible, thus we conclude
                  unboundedness/infeasibility. */
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ILEAVE03 unboundedness/infeasibility found "
                             << "in leave()" << std::endl;)

               rejectLeave(leaveNum, leaveId, leaveStat);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               /**@todo if shift() is not zero we must not conclude unboundedness */
               if(rep() == ROW)
               {
                  computePrimalray4Row(enterVal);
                  setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
               }
               else
               {
                  computeDualfarkas4Col(enterVal);
                  setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
               }

               return false;
            }
            else
            {
               theFvec->delta().clear();
               rejectLeave(leaveNum, leaveId, leaveStat, &newVector);
               this->change(-1, none, nullptr);
               objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case

               SPxOut::debug(this, "DLEAVE63 rejecting leave B (leaveIdx={}, theCoTest={})\n", leaveIdx,
                             theCoTest[leaveIdx]);

               // Note: These changes do not survive a refactorization
               theCoTest[leaveIdx] *= 0.01;

               return true;
            }
         }

         //      process leaving variable
         if(leavebound > epsilon() || leavebound < -epsilon())
            theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

         //      process entering variable
         R enterBound;
         R newUBbound;
         R newLBbound;
         R newCoPrhs;

         try
         {
            getLeaveVals2(leaveMax, enterId, enterBound, newUBbound, newLBbound, newCoPrhs, objChange);
         }
         catch(const SPxException& F)
         {
            rejectLeave(leaveNum, leaveId, leaveStat);
            this->change(-1, none, nullptr);
            objChange = R(0.0); // the nonbasicValue is not supposed to be updated in this case
            throw F;
         }

         theUBbound[leaveIdx] = newUBbound;
         theLBbound[leaveIdx] = newLBbound;
         (*theCoPrhs)[leaveIdx] = newCoPrhs;

         if(enterBound > epsilon() || enterBound < -epsilon())
            theFrhs->multAdd(enterBound, newVector);

         // update pricing vectors
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vector
         theFvec->value() = -((*theFvec)[leaveIdx] - leavebound)
                            / theFvec->delta()[leaveIdx];
         theFvec->update();
         (*theFvec)[leaveIdx] = enterBound - theFvec->value();
         updateFtest();

         // update objective funtion value
         updateNonbasicValue(objChange);

         //  change basis matrix
         this->change(leaveIdx, enterId, &newVector, &(theFvec->delta()));
      }

      /*
        No entering vector has been selected from the basis. However, if the
        shift amount for |coPvec| is bounded, we are in the case, that the
        entering variable is moved from one bound to its other, before any of
        the basis feasibility variables reaches their bound. This may only
        happen in primal/columnwise case with upper and lower bounds on
        variables.
      */
      else
      {
         // @todo update obj function value here!!!
         assert(rep() == ROW);
         typename SPxBasisBase<R>::Desc& ds = this->desc();

         this->change(leaveIdx, none, nullptr);

         if(leaveStat == SPxBasisBase<R>::Desc::P_ON_UPPER)
         {
            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLRbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
               (*theCoPrhs)[leaveIdx] = theLCbound[leaveNum];
            }

            theUBbound[leaveIdx] = 0;
            theLBbound[leaveIdx] = R(-infinity);
         }
         else
         {
            assert(leaveStat == SPxBasisBase<R>::Desc::P_ON_LOWER);

            if(leaveId.isSPxRowId())
            {
               ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theURbound[leaveNum];
            }
            else
            {
               ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
               (*theCoPrhs)[leaveIdx] = theUCbound[leaveNum];
            }

            theUBbound[leaveIdx] = R(infinity);
            theLBbound[leaveIdx] = 0;
         }

         // update copricing vector
         theCoPvec->value() = enterVal;
         thePvec->value() = enterVal;

         if(enterVal > epsilon() || enterVal < -epsilon())
            doPupdate();

         // update feasibility vectors
         theFvec->value() = 0;
         assert(theCoTest[leaveIdx] < 0.0);
         m_pricingViol += theCoTest[leaveIdx];
         theCoTest[leaveIdx] *= -1;
      }

      if((leaveMax > entertol() && enterVal <= entertol()) || (leaveMax < -entertol()
            && enterVal >= -entertol()))
      {
         if((theUBbound[leaveIdx] < R(infinity) || theLBbound[leaveIdx] > R(-infinity))
               && leaveStat != SPxBasisBase<R>::Desc::P_FREE
               && leaveStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            leaveCycles++;
         }
      }
      else
         m_numCycle /= 2;

#ifdef ENABLE_ADDITIONAL_CHECKS
      {
         VectorBase<R> tmp = fVec();
         this->multBaseWith(tmp);
         tmp -= fRhs();

         if(tmp.length() > entertol())
         {
            // This happens very frequently and does usually not hurt, so print
            // these warnings only with verbose level INFO2 and higher.
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE64\t" << basis().iteration()
                          << ": fVec error = " << tmp.length() << std::endl;)
            SPxBasisBase<R>::solve(tmp, fRhs());
            tmp -= fVec();
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WLEAVE65\t(" << tmp.length() << ")\n";)
         }
      }
#endif  // ENABLE_ADDITIONAL_CHECKS

      return true;
   }
}